

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  long *plVar7;
  char **ppcVar8;
  string *this;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  int maximum_index;
  string data_type;
  string print_format;
  ostringstream error_message_5;
  ifstream ifs;
  int local_41c;
  undefined1 *local_418 [2];
  undefined1 local_408 [16];
  undefined8 local_3f8;
  string local_3f0;
  undefined1 *local_3d0;
  char *local_3c8;
  undefined1 local_3c0 [16];
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_41c = -1;
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"d","");
  local_3f8 = 0;
LAB_001036ee:
  do {
    while (iVar3 = ya_getopt_long(argc,argv,"l:m:f:h",(option *)0x0,(int *)0x0), pcVar11 = local_3c8
          , pcVar10 = ya_optarg, iVar3 == 0x66) {
      strlen(ya_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_3d0,0,pcVar11,(ulong)pcVar10);
      std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_3d0);
      iVar3 = std::__cxx11::string::compare((char *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (iVar3 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -f option must be begin with ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"%",1);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_00103b62;
      }
    }
    if (iVar3 < 0x6c) {
      if (iVar3 == -1) {
        uVar4 = argc - ya_optind;
        if (uVar4 == 0 || argc < ya_optind) {
          pcVar11 = (char *)0x0;
          goto LAB_00103a44;
        }
        lVar9 = (ulong)uVar4 + 1;
        ppcVar8 = argv + ((long)argc - (ulong)uVar4);
        pcVar10 = (char *)0x0;
        goto LAB_00103921;
      }
      if (iVar3 == 0x68) {
        iVar3 = 0;
        anon_unknown.dwarf_20c1::PrintUsage((ostream *)&std::cout);
      }
      else {
LAB_001038d3:
        iVar3 = 1;
        anon_unknown.dwarf_20c1::PrintUsage((ostream *)&std::cerr);
      }
      goto LAB_00103b97;
    }
    if (iVar3 == 0x6c) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar12 = sptk::ConvertStringToInteger(&local_238,&local_41c);
      bVar1 = local_41c < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      local_3f8 = 1;
      if (!bVar12 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_00103b62;
      }
      goto LAB_001036ee;
    }
    if (iVar3 != 0x6d) goto LAB_001038d3;
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
    bVar1 = sptk::ConvertStringToInteger(&local_238,&local_41c);
    bVar12 = -1 < local_41c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    local_3f8 = 0;
  } while (bVar1 && bVar12);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_238,"non-negative integer",0x14);
  local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
  sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
  goto LAB_00103b62;
LAB_00103921:
  do {
    pcVar11 = *ppcVar8;
    if (*pcVar11 == '+') {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      sVar6 = strlen(pcVar11);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,pcVar11,pcVar11 + sVar6);
      std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_238);
      std::__cxx11::string::operator=((string *)local_418,(string *)local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      pcVar11 = pcVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
    }
    else if (pcVar10 != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Too many input files",0x14);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p == &local_3b0[0].field_2) goto LAB_00103b71;
      goto LAB_00103b6c;
    }
    lVar9 = lVar9 + -1;
    ppcVar8 = ppcVar8 + 1;
    pcVar10 = pcVar11;
  } while (1 < lVar9);
LAB_00103a44:
  bVar1 = sptk::SetBinaryMode();
  if (bVar1) {
    this = &local_238;
    std::ifstream::ifstream(this);
    if ((pcVar11 == (char *)0x0) ||
       (std::ifstream::open((char *)&local_238,(_Ios_Openmode)pcVar11),
       (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
      cVar2 = std::__basic_file<char>::is_open();
      iVar3 = local_41c;
      if (cVar2 == '\0') {
        this = (string *)&std::cin;
      }
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3b0,local_3d0,local_3c8 + (long)local_3d0);
      iVar5 = std::__cxx11::string::compare((char *)local_418);
      if (iVar5 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)0x0,0x10d331);
        }
        plVar7 = (long *)operator_new(0x30);
        *plVar7 = (long)&PTR__DataDump_001129a8;
        plVar7[1] = (long)(plVar7 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
LAB_0010431b:
        *(int *)(plVar7 + 5) = (int)local_3f8;
        *(int *)((long)plVar7 + 0x2c) = iVar3;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)0x0,0x10d331);
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_001129f8;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)0x0,0x10d331);
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112a38;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)0x0,0x10d331);
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112a78;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%lld");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112ab8;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%u");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112af8;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%u");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112b38;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%u");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112b78;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%u");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112bb8;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%llu");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112bf8;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%g");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112c38;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%g");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112c78;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_418);
        if (iVar5 == 0) {
          if (local_3b0[0]._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)local_3b0,"%Lg");
          }
          plVar7 = (long *)operator_new(0x30);
          *plVar7 = (long)&PTR__DataDump_00112cb8;
          plVar7[1] = (long)(plVar7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(plVar7 + 1),local_3b0[0]._M_dataplus._M_p,
                     local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
          goto LAB_0010431b;
        }
        plVar7 = (long *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      if (plVar7 == (long *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Unexpected argument for the +type option",0x28);
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"dmp","");
        sptk::PrintErrorMessage(&local_3f0,(ostringstream *)local_3b0);
        goto LAB_00104436;
      }
      cVar2 = (**(code **)(*plVar7 + 0x10))(plVar7,this);
      iVar3 = 0;
      if (cVar2 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Failed to dump",0xe);
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"dmp","");
        sptk::PrintErrorMessage(&local_3f0,(ostringstream *)local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
        iVar3 = 1;
      }
      (**(code **)(*plVar7 + 8))(plVar7);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Cannot open file ",0x11);
      sVar6 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,pcVar11,sVar6);
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"dmp","");
      sptk::PrintErrorMessage(&local_3f0,(ostringstream *)local_3b0);
LAB_00104436:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      iVar3 = 1;
    }
    std::ifstream::~ifstream(&local_238);
    goto LAB_00103b97;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_238,"Cannot set translation mode",0x1b);
  local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
  sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_00103b62:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
LAB_00103b6c:
    operator_delete(local_3b0[0]._M_dataplus._M_p);
  }
LAB_00103b71:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  iVar3 = 1;
LAB_00103b97:
  if (local_418[0] != local_408) {
    operator_delete(local_418[0]);
  }
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int minimum_index(0);
  int maximum_index(kMagicNumberForEndOfFile);
  std::string print_format("");
  std::string data_type(kDefaultDataType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &maximum_index) ||
            maximum_index <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        minimum_index = 1;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &maximum_index) ||
            maximum_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        minimum_index = 0;
        break;
      }
      case 'f': {
        print_format = optarg;
        if ("%" != print_format.substr(0, 1)) {
          std::ostringstream error_message;
          error_message << "The argument for the -f option must be begin with "
                        << "%";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("dmp", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("dmp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  DataDumpWrapper data_dump(data_type, print_format, minimum_index,
                            maximum_index);

  if (!data_dump.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  if (!data_dump.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to dump";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  return 0;
}